

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfont.cpp
# Opt level: O0

QString * __thiscall QFont::defaultFamily(QFont *this)

{
  long lVar1;
  bool bVar2;
  undefined8 in_RSI;
  QList<QString> *in_RDI;
  long in_FS_OFFSET;
  QStringList fallbacks;
  QList<QString> *this_00;
  ExtendedScript in_stack_ffffffffffffffb4;
  QList<QString> *family;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  family = in_RDI;
  QString::QString((QString *)0x715e84);
  QExplicitlySharedDataPointer<QFontPrivate>::operator->
            ((QExplicitlySharedDataPointer<QFontPrivate> *)0x715e8e);
  qt_fallbacksForFamily
            ((QString *)family,(Style)((ulong)in_RSI >> 0x20),(StyleHint)in_RSI,
             in_stack_ffffffffffffffb4);
  QString::~QString((QString *)0x715ebf);
  bVar2 = QList<QString>::isEmpty((QList<QString> *)0x715ec9);
  if (bVar2) {
    QString::QString((QString *)0x715ef6);
  }
  else {
    QList<QString>::first(this_00);
    QString::QString((QString *)this_00,(QString *)in_RDI);
  }
  QList<QString>::~QList((QList<QString> *)0x715f08);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QString *)this_00;
  }
  __stack_chk_fail();
}

Assistant:

QString QFont::defaultFamily() const
{
    const QStringList fallbacks = qt_fallbacksForFamily(QString(),
                                                        QFont::StyleNormal,
                                                        QFont::StyleHint(d->request.styleHint),
                                                        QFontDatabasePrivate::Script_Common);
    if (!fallbacks.isEmpty())
        return fallbacks.first();
    return QString();
}